

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int geopolyFindFunction(sqlite3_vtab *pVtab,int nArg,char *zName,
                       _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr **pxFunc,
                       void **ppArg)

{
  byte bVar1;
  int iVar2;
  code *pcVar3;
  long lVar4;
  
  if (zName == (char *)0x0) {
    return 0;
  }
  lVar4 = 0;
  pcVar3 = geopolyOverlapFunc;
  do {
    bVar1 = zName[lVar4];
    if (bVar1 == "geopoly_overlap"[lVar4]) {
      if ((ulong)bVar1 == 0) goto LAB_001ffcfa;
    }
    else if (""[bVar1] != ""[(byte)"geopoly_overlap"[lVar4]]) {
      if (zName == (char *)0x0) {
        return 0;
      }
      lVar4 = 0;
      pcVar3 = geopolyWithinFunc;
      break;
    }
    lVar4 = lVar4 + 1;
  } while( true );
LAB_001ffd16:
  bVar1 = zName[lVar4];
  if (bVar1 == "geopoly_within"[lVar4]) {
    if ((ulong)bVar1 == 0) goto LAB_001ffd3e;
  }
  else if (""[bVar1] != ""[(byte)"geopoly_within"[lVar4]]) {
    return 0;
  }
  lVar4 = lVar4 + 1;
  goto LAB_001ffd16;
LAB_001ffd3e:
  iVar2 = 0x97;
  goto LAB_001ffd43;
LAB_001ffcfa:
  iVar2 = 0x96;
LAB_001ffd43:
  *pxFunc = pcVar3;
  *ppArg = (void *)0x0;
  return iVar2;
}

Assistant:

SQLITE_API int sqlite3_stricmp(const char *zLeft, const char *zRight){
  if( zLeft==0 ){
    return zRight ? -1 : 0;
  }else if( zRight==0 ){
    return 1;
  }
  return sqlite3StrICmp(zLeft, zRight);
}